

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::ICUDataTable::getNoFallback
          (ICUDataTable *this,char *tableKey,char *subTableKey,char *itemKey,UnicodeString *result)

{
  short sVar1;
  int32_t srcLength;
  UChar *srcChars;
  int32_t length;
  int32_t len;
  UErrorCode status;
  int32_t local_28;
  UErrorCode local_24;
  
  local_24 = U_ZERO_ERROR;
  local_28 = 0;
  srcChars = uloc_getTableStringWithFallback_63
                       (this->path,(this->locale).fullName,tableKey,subTableKey,itemKey,&local_28,
                        &local_24);
  srcLength = local_28;
  if (local_24 < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::UnicodeString::unBogus(result);
    sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (result->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    result = icu_63::UnicodeString::doReplace(result,0,length,srcChars,0,srcLength);
  }
  else {
    icu_63::UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString &
ICUDataTable::getNoFallback(const char* tableKey, const char* subTableKey, const char* itemKey,
                            UnicodeString& result) const {
  UErrorCode status = U_ZERO_ERROR;
  int32_t len = 0;

  const UChar *s = uloc_getTableStringWithFallback(path, locale.getName(),
                                                   tableKey, subTableKey, itemKey,
                                                   &len, &status);
  if (U_SUCCESS(status)) {
    return result.setTo(s, len);
  }

  result.setToBogus();
  return result;
}